

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall crnlib::dynamic_string::set(dynamic_string *this,char *p,uint max_len)

{
  char *__dest;
  uint uVar1;
  size_t sVar2;
  size_t __n;
  
  sVar2 = strlen(p);
  __n = sVar2 & 0xffffffff;
  if (max_len < (uint)sVar2) {
    __n = (size_t)max_len;
  }
  uVar1 = (uint)__n;
  if (uVar1 - 0xffff < 0xffff0002) {
    clear(this);
  }
  else {
    __dest = this->m_pStr;
    if (p < __dest + this->m_buf_size && (__dest <= p && __dest != (char *)0x0)) {
      if (__dest != p) {
        memmove(__dest,p,__n);
      }
      this->m_pStr[__n] = '\0';
      this->m_len = (uint16)__n;
    }
    else {
      if (this->m_buf_size <= uVar1 && uVar1 < 0xffff) {
        expand_buf(this,uVar1 + 1,false);
      }
      if (uVar1 < this->m_buf_size) {
        this->m_len = (uint16)__n;
        memcpy(this->m_pStr,p,(ulong)(uVar1 + 1));
      }
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::set(const char* p, uint max_len)
    {
        CRNLIB_ASSERT(p);

        const uint len = math::minimum<uint>(max_len, static_cast<uint>(strlen(p)));
        CRNLIB_ASSERT(len < cUINT16_MAX);

        if ((!len) || (len >= cUINT16_MAX))
        {
            clear();
        }
        else if ((m_pStr) && (p >= m_pStr) && (p < (m_pStr + m_buf_size)))
        {
            if (m_pStr != p)
            {
                memmove(m_pStr, p, len);
            }
            m_pStr[len] = '\0';
            m_len = static_cast<uint16>(len);
        }
        else if (ensure_buf(len, false))
        {
            m_len = static_cast<uint16>(len);
            memcpy(m_pStr, p, m_len + 1);
        }

        check();

        return *this;
    }